

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

IOStream * __thiscall Assimp::MemoryIOSystem::Open(MemoryIOSystem *this,char *pFile,char *pMode)

{
  int iVar1;
  MemoryIOStream *this_00;
  reference ppIVar2;
  undefined4 extraout_var;
  char *num_bytes;
  MemoryIOSystem *local_60;
  MemoryIOStream *local_30;
  char *local_28;
  char *pMode_local;
  char *pFile_local;
  MemoryIOSystem *this_local;
  
  num_bytes = "$$$___magic___$$$";
  local_28 = pMode;
  pMode_local = pFile;
  pFile_local = (char *)this;
  iVar1 = strncmp(pFile,"$$$___magic___$$$",0x11);
  if (iVar1 == 0) {
    this_00 = (MemoryIOStream *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,(size_t)num_bytes);
    MemoryIOStream::MemoryIOStream(this_00,this->buffer,this->length,false);
    local_30 = this_00;
    std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>::
    emplace_back<Assimp::MemoryIOStream*>
              ((vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>> *)&this->created_streams
               ,&local_30);
    ppIVar2 = std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::back
                        (&this->created_streams);
    this_local = (MemoryIOSystem *)*ppIVar2;
  }
  else {
    if (this->existing_io == (IOSystem *)0x0) {
      local_60 = (MemoryIOSystem *)0x0;
    }
    else {
      iVar1 = (*this->existing_io->_vptr_IOSystem[4])(this->existing_io,pMode_local,local_28);
      local_60 = (MemoryIOSystem *)CONCAT44(extraout_var,iVar1);
    }
    this_local = local_60;
  }
  return (IOStream *)this_local;
}

Assistant:

IOStream* Open(const char* pFile, const char* pMode = "rb") override {
        if ( 0 == strncmp( pFile, AI_MEMORYIO_MAGIC_FILENAME, AI_MEMORYIO_MAGIC_FILENAME_LENGTH ) ) {
            created_streams.emplace_back(new MemoryIOStream(buffer, length));
            return created_streams.back();
        }
        return existing_io ? existing_io->Open(pFile, pMode) : NULL;
    }